

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int read_chars(lua_State *L,FILE *f,size_t n)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong __n;
  luaL_Buffer b;
  luaL_Buffer local_2048;
  
  local_2048.lvl = 0;
  __n = 0x2000;
  local_2048.p = local_2048.buffer;
  local_2048.L = L;
  do {
    iVar1 = emptybuffer(&local_2048);
    if (iVar1 != 0) {
      adjuststack(&local_2048);
    }
    if (n <= __n) {
      __n = n;
    }
    sVar3 = fread(local_2048.buffer,1,__n,(FILE *)f);
    local_2048.p = local_2048.p + sVar3;
    n = n - sVar3;
  } while ((sVar3 == __n) && (n != 0));
  emptybuffer(&local_2048);
  lua_concat(local_2048.L,local_2048.lvl);
  local_2048.lvl = 1;
  if (n == 0) {
    uVar2 = 1;
  }
  else {
    sVar4 = lua_objlen(L,-1);
    uVar2 = (uint)(sVar4 != 0);
  }
  return uVar2;
}

Assistant:

static int read_chars(lua_State*L,FILE*f,size_t n){
size_t rlen;
size_t nr;
luaL_Buffer b;
luaL_buffinit(L,&b);
rlen=BUFSIZ;
do{
char*p=luaL_prepbuffer(&b);
if(rlen>n)rlen=n;
nr=fread(p,sizeof(char),rlen,f);
luaL_addsize(&b,nr);
n-=nr;
}while(n>0&&nr==rlen);
luaL_pushresult(&b);
return(n==0||lua_objlen(L,-1)>0);
}